

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathutil.c
# Opt level: O0

uint64_t expmod(uint64_t b,uint64_t x,uint64_t n)

{
  uint64_t in_RDX;
  ulong in_RSI;
  uint64_t res;
  uint64_t q;
  
  q = 1;
  for (; in_RSI != 0; in_RSI = in_RSI >> 1) {
    if ((in_RSI & 1) != 0) {
      q = mulmod(in_RSI,in_RDX,q);
    }
    mulmod(in_RSI,in_RDX,q);
  }
  return q;
}

Assistant:

uint64_t expmod(uint64_t b, uint64_t x, uint64_t n) {
    // perform an efficient exponentiation by squaring
    uint64_t res = 1;
    while(x > 0) {
        if(x & 0x0000000000000001) {
            res = mulmod(res, b, n);
        }
        b = mulmod(b, b, n);
        x >>= 1;
    }
    return res;
}